

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

leaf_t add_container(roaring64_bitmap_t *r,container_t *container,uint8_t typecode)

{
  ulong uVar1;
  container_t **ppcVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t size;
  
  uVar1 = r->first_free;
  uVar5 = r->capacity;
  uVar3 = uVar1;
  if (uVar1 == uVar5) {
    if (uVar1 == 0) {
      uVar5 = 2;
    }
    else if (uVar1 < 0x400) {
      uVar5 = uVar1 * 2;
    }
    else {
      uVar5 = uVar1 * 5 >> 2;
    }
    ppcVar2 = (container_t **)roaring_realloc(r->containers,uVar5 * 8);
    r->containers = ppcVar2;
    memset(ppcVar2 + r->capacity,0,(uVar5 - uVar1) * 8);
    r->capacity = uVar5;
    uVar3 = r->first_free;
  }
  do {
    uVar3 = uVar3 + 1;
    uVar4 = uVar5;
    if (uVar5 <= uVar3) break;
    uVar4 = uVar3;
  } while (r->containers[uVar3] != (container_t *)0x0);
  r->first_free = uVar4;
  r->containers[uVar1] = container;
  return (ulong)typecode | uVar1 << 8;
}

Assistant:

static leaf_t add_container(roaring64_bitmap_t *r, container_t *container,
                            uint8_t typecode) {
    uint64_t index = allocate_index(r);
    r->containers[index] = container;
    return create_leaf(index, typecode);
}